

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# log_handle.c
# Opt level: O0

int log_handle_clear(log_handle handle)

{
  void *pvVar1;
  undefined8 *in_RDI;
  void *buffer;
  size_t default_size;
  
  in_RDI[1] = 0;
  if (in_RDI[2] != 0x100) {
    pvVar1 = realloc((void *)*in_RDI,0x100);
    if (pvVar1 == (void *)0x0) {
      return 1;
    }
    *in_RDI = pvVar1;
    in_RDI[2] = 0x100;
  }
  return 0;
}

Assistant:

int log_handle_clear(log_handle handle)
{
	handle->count = 0;

	if (handle->size != LOG_HANDLE_RECORD_SIZE_DEFAULT)
	{
		const size_t default_size = LOG_HANDLE_RECORD_SIZE_DEFAULT;

		register void *buffer = realloc(handle->buffer, default_size);

		if (buffer == NULL)
		{
			return 1;
		}

		handle->buffer = buffer;

		handle->size = default_size;
	}

	return 0;
}